

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

void __thiscall Refal2::COperationsExecuter::matchRightBeginSaveToTable_E(COperationsExecuter *this)

{
  this->operation = this->operation->next;
  saveState(this);
  saveToTable(this,(CUnitNode *)0x0,(CUnitNode *)0x0);
  this->operation = this->operation->next;
  return;
}

Assistant:

inline void COperationsExecuter::matchRightBeginSaveToTable_E()
{
	nextOperation();
	saveState();
	saveToTable( 0, 0 );
	nextOperation();
}